

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  char cVar1;
  ushort uVar2;
  pointer paVar3;
  type_info *ptVar4;
  PyTypeObject *pPVar5;
  handle obj;
  function_record *pfVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  char *pcVar10;
  type_info *ptVar11;
  function_record *pfVar12;
  PyMethodDef *pPVar13;
  PyObject *pPVar14;
  PyObject *pPVar15;
  function_record *pfVar16;
  ushort uVar17;
  byte bVar18;
  uint uVar19;
  object *object;
  pointer paVar20;
  ulong uVar21;
  string signatures;
  long local_1b0;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  char *local_1a0;
  undefined1 local_198 [24];
  object local_180;
  object scope_module;
  string signature;
  capsule rec_capsule_1;
  undefined1 local_108 [24];
  object local_f0;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_e8;
  type_info **local_e0;
  str local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pcVar10 = "";
  if (rec->name != (char *)0x0) {
    pcVar10 = rec->name;
  }
  local_e0 = types;
  pcVar10 = strdup(pcVar10);
  rec->name = pcVar10;
  if (rec->doc != (char *)0x0) {
    pcVar10 = strdup(rec->doc);
    rec->doc = pcVar10;
  }
  local_e8 = &rec->args;
  paVar3 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar20 = (rec->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_start; paVar20 != paVar3;
      paVar20 = paVar20 + 0x20) {
    if (*(char **)paVar20 != (char *)0x0) {
      pcVar10 = strdup(*(char **)paVar20);
      *(char **)paVar20 = pcVar10;
    }
    if (*(char **)(paVar20 + 8) == (char *)0x0) {
      if (*(PyObject **)(paVar20 + 0x10) != (PyObject *)0x0) {
        repr((pybind11 *)&signatures,*(PyObject **)(paVar20 + 0x10));
        cast<std::__cxx11::string>(&signature,(pybind11 *)&signatures,object);
        pcVar10 = strdup(signature._M_dataplus._M_p);
        *(char **)(paVar20 + 8) = pcVar10;
        std::__cxx11::string::~string((string *)&signature);
        pybind11::object::~object((object *)&signatures);
      }
    }
    else {
      pcVar10 = strdup(*(char **)(paVar20 + 8));
      *(char **)(paVar20 + 8) = pcVar10;
    }
  }
  pcVar10 = rec->name;
  iVar9 = strcmp(pcVar10,"__init__");
  if (iVar9 == 0) {
    uVar17 = 1;
  }
  else {
    iVar9 = strcmp(pcVar10,"__setstate__");
    uVar17 = (ushort)(iVar9 == 0);
  }
  uVar2 = *(ushort *)&rec->field_0x59;
  uVar19 = uVar2 & 0xfffffffe | (uint)uVar17;
  *(short *)&rec->field_0x59 = (short)uVar19;
  if (((uVar2 & 2) == 0 & (byte)uVar17) == 1) {
    detail::get_fully_qualified_tp_name_abi_cxx11_
              (&signature,(detail *)(rec->scope).m_ptr,(PyTypeObject *)(ulong)uVar19);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&signatures,rec->name,(allocator<char> *)&rec_capsule_1);
    uVar7 = _PyExc_FutureWarning;
    std::operator+(&local_d0,"pybind11-bound class \'",&signature);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   &local_d0,"\' is using an old-style placement-new \'");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &scope_module,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   &signatures);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &rec_capsule_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &scope_module,
                   "\' which has been deprecated. See the upgrade guide in pybind11\'s docs. This message is only visible when compiled in debug mode."
                  );
    PyErr_WarnEx(uVar7,rec_capsule_1.super_object.super_handle.m_ptr,0);
    std::__cxx11::string::~string((string *)&rec_capsule_1);
    std::__cxx11::string::~string((string *)&scope_module);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&signatures);
    std::__cxx11::string::~string((string *)&signature);
  }
  signature._M_dataplus._M_p = (pointer)&signature.field_2;
  signature._M_string_length = 0;
  signature.field_2._M_local_buf[0] = '\0';
  local_1a0 = text + 1;
  uVar21 = 0;
  local_1b0 = 0;
  do {
    cVar1 = local_1a0[-1];
    if (cVar1 == '%') {
      ptVar4 = local_e0[local_1b0];
      if (ptVar4 == (type_info *)0x0) {
        pybind11_fail("Internal error while parsing type signature (1)");
      }
      signatures._M_dataplus._M_p = (pointer)ptVar4;
      ptVar11 = detail::get_type_info((type_index *)&signatures,false);
      local_1b0 = local_1b0 + 1;
      if (ptVar11 == (type_info *)0x0) {
        if ((uVar21 == 0 & (byte)rec->field_0x59 >> 1) == 1) {
          local_198._8_8_ = (rec->scope).m_ptr;
          local_198._16_8_ = "__module__";
          local_180.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &scope_module,
                     (accessor<pybind11::detail::accessor_policies::str_attr> *)local_198);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scope_module,".");
          local_108._8_8_ = (rec->scope).m_ptr;
          local_108._16_8_ = "__qualname__";
          local_f0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          detail::accessor<pybind11::detail::accessor_policies::str_attr>::
          cast<std::__cxx11::string>
                    (&local_d0,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_108)
          ;
          std::operator+(&signatures,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,&local_d0);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&signatures);
          std::__cxx11::string::~string((string *)&local_d0);
          pybind11::object::~object(&local_f0);
          std::__cxx11::string::~string((string *)&rec_capsule_1);
          std::__cxx11::string::~string((string *)&scope_module);
          pybind11::object::~object(&local_180);
          uVar21 = 0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&signatures,*(char **)(ptVar4 + 8) + (**(char **)(ptVar4 + 8) == '*')
                     ,(allocator<char> *)&rec_capsule_1);
          detail::clean_type_id(&signatures);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&signatures);
        }
      }
      else {
        pPVar5 = ptVar11->type;
        local_198._16_8_ = "__module__";
        local_180.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_198._8_8_ = pPVar5;
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &scope_module,
                   (accessor<pybind11::detail::accessor_policies::str_attr> *)local_198);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scope_module,".");
        local_108._16_8_ = "__qualname__";
        local_f0.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_108._8_8_ = pPVar5;
        detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<std::__cxx11::string>
                  (&local_d0,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_108);
        std::operator+(&signatures,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,&local_d0);
        std::__cxx11::string::append((string *)&signature);
        std::__cxx11::string::~string((string *)&signatures);
        std::__cxx11::string::~string((string *)&local_d0);
        pybind11::object::~object(&local_f0);
        std::__cxx11::string::~string((string *)&rec_capsule_1);
        std::__cxx11::string::~string((string *)&scope_module);
        pybind11::object::~object(&local_180);
      }
    }
    else if (cVar1 == '{') {
      if (*local_1a0 != '*') {
        if (rec->nargs_kw_only + uVar21 == args && rec->nargs_kw_only != 0) {
          std::__cxx11::string::append((char *)&signature);
        }
        paVar20 = (rec->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((uVar21 < (ulong)((long)(rec->args).
                                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar20 >> 5
                              )) && (*(long *)(paVar20 + uVar21 * 0x20) != 0)) ||
           ((*(ushort *)&rec->field_0x59 & 0x10) != 0 && uVar21 == 0)) {
          std::__cxx11::string::append((char *)&signature);
        }
        else {
          std::__cxx11::to_string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rec_capsule_1,uVar21 - ((*(ushort *)&rec->field_0x59 >> 4 & 1) != 0));
          std::operator+(&signatures,"arg",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1);
          std::__cxx11::string::append((string *)&signature);
          std::__cxx11::string::~string((string *)&signatures);
          std::__cxx11::string::~string((string *)&rec_capsule_1);
        }
        std::__cxx11::string::append((char *)&signature);
      }
    }
    else if (cVar1 == '}') {
      paVar20 = (rec->args).
                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar21 < (ulong)((long)(rec->args).
                                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)paVar20 >> 5))
         && (*(long *)(paVar20 + uVar21 * 0x20 + 8) != 0)) {
        std::__cxx11::string::append((char *)&signature);
        std::__cxx11::string::append((char *)&signature);
      }
      uVar21 = uVar21 + 1;
      if (uVar21 == rec->nargs_pos_only && rec->nargs_pos_only != 0) {
        std::__cxx11::string::append((char *)&signature);
      }
    }
    else {
      if (cVar1 == '\0') break;
      std::__cxx11::string::push_back((char)&signature);
    }
    local_1a0 = local_1a0 + 1;
  } while( true );
  if ((uVar21 != args) || (local_e0[local_1b0] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar10 = strdup(signature._M_dataplus._M_p);
  rec->signature = pcVar10;
  std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  ::_M_shrink_to_fit(local_e8);
  rec->nargs = (uint16_t)args;
  pPVar14 = (rec->sibling).m_ptr;
  if (pPVar14 != (PyObject *)0x0) {
    if (pPVar14->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar14 = (PyObject *)pPVar14[1].ob_refcnt;
      (rec->sibling).m_ptr = pPVar14;
      if (pPVar14 == (PyObject *)0x0) goto LAB_0010c6cb;
    }
    iVar9 = _PyObject_TypeCheck(pPVar14,(PyTypeObject *)&PyCFunction_Type);
    if (iVar9 == 0) {
      if (((rec->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*rec->name != '_')) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&scope_module,rec->name,(allocator<char> *)local_198);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,"Cannot overload existing non-function object \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &scope_module);
        std::operator+(&signatures,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,"\" with a function of the same name");
        pybind11_fail(&signatures);
      }
    }
    else {
      pPVar14 = (rec->sibling).m_ptr;
      if ((*(byte *)(pPVar14[1].ob_refcnt + 0x10) & 0x20) == 0) {
        signatures._M_dataplus._M_p = (pointer)pPVar14[1].ob_type;
        if ((PyTypeObject *)signatures._M_dataplus._M_p != (PyTypeObject *)0x0) {
          (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt =
               (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt + 1;
        }
      }
      else {
        signatures._M_dataplus._M_p = (pointer)0x0;
      }
      pfVar12 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)&signatures);
      pPVar14 = (pfVar12->scope).m_ptr;
      pPVar15 = (rec->scope).m_ptr;
      pybind11::object::~object((object *)&signatures);
      if (pPVar14 == pPVar15) {
        pPVar14 = (rec->sibling).m_ptr;
        (this->super_function).super_object.super_handle.m_ptr = pPVar14;
        if (pPVar14 != (PyObject *)0x0) {
          pPVar14->ob_refcnt = pPVar14->ob_refcnt + 1;
        }
        uVar17 = *(ushort *)&rec->field_0x59;
        if (((*(ushort *)&pfVar12->field_0x59 ^ uVar17) & 0x10) != 0) {
          pcVar10 = "instance";
          if ((uVar17 & 0x10) == 0) {
            pcVar10 = "static";
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar10,&local_1a1)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,
                         "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                         ,&local_70);
          std::operator+(&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108," method ");
          local_50.obj.m_ptr = (rec->scope).m_ptr;
          local_50.key = "__name__";
          local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
          str::str<pybind11::detail::accessor_policies::str_attr>(&local_d8,&local_50);
          str::operator_cast_to_string(&local_90,&local_d8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198,&local_d0,&local_90);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scope_module,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198,".");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,rec->name,&local_1a2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &scope_module,&local_b0);
          std::operator+(&signatures,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &rec_capsule_1,&signature);
          pybind11_fail(&signatures);
        }
        pfVar6 = pfVar12;
        if ((uVar17 >> 8 & 1) == 0) {
          do {
            pfVar16 = pfVar6;
            pfVar6 = pfVar16->next;
          } while (pfVar6 != (function_record *)0x0);
          pfVar16->next = rec;
        }
        else {
          rec->next = pfVar12;
          signatures._M_dataplus._M_p = (pointer)pPVar14[1].ob_type;
          if ((PyTypeObject *)signatures._M_dataplus._M_p != (PyTypeObject *)0x0) {
            (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt =
                 (((PyTypeObject *)signatures._M_dataplus._M_p)->ob_base).ob_base.ob_refcnt + 1;
          }
          capsule::set_pointer((capsule *)&signatures,rec);
          pybind11::object::~object((object *)&signatures);
          pfVar12 = rec;
        }
        signatures._M_dataplus._M_p = (pointer)&signatures.field_2;
        signatures._M_string_length = 0;
        signatures.field_2._M_allocated_capacity =
             signatures.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (DAT_00123749 == 1) {
          std::__cxx11::string::append((char *)&signatures);
          std::__cxx11::string::append((char *)&signatures);
          std::__cxx11::string::append((char *)&signatures);
        }
        local_1a0 = (char *)((ulong)local_1a0 & 0xffffffff00000000);
        goto LAB_0010c81d;
      }
    }
  }
LAB_0010c6cb:
  pPVar13 = (PyMethodDef *)operator_new(0x20);
  rec->def = pPVar13;
  *(undefined8 *)&pPVar13->ml_flags = 0;
  pPVar13->ml_doc = (char *)0x0;
  pPVar13->ml_name = rec->name;
  pPVar13->ml_meth = dispatcher;
  pPVar13->ml_flags = 3;
  capsule::capsule(&rec_capsule_1,rec,initialize_generic::anon_class_1_0_00000001::__invoke);
  scope_module.super_handle.m_ptr = (handle)(PyObject *)0x0;
  obj.m_ptr = (rec->scope).m_ptr;
  if (obj.m_ptr != (PyObject *)0x0) {
    bVar8 = hasattr(obj,"__module__");
    if (bVar8) {
      signatures._M_string_length = (size_type)(rec->scope).m_ptr;
      signatures.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_34da1;
      signatures.field_2._8_8_ = 0;
      detail::accessor::operator_cast_to_object((accessor *)local_198);
    }
    else {
      bVar8 = hasattr((rec->scope).m_ptr,"__name__");
      if (!bVar8) goto LAB_0010c7c2;
      signatures._M_string_length = (size_type)(rec->scope).m_ptr;
      signatures.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_34a37;
      signatures.field_2._8_8_ = 0;
      detail::accessor::operator_cast_to_object((accessor *)local_198);
    }
    pybind11::object::operator=(&scope_module,(object *)local_198);
    pybind11::object::~object((object *)local_198);
    pybind11::object::~object((object *)((long)&signatures.field_2 + 8));
  }
LAB_0010c7c2:
  pPVar14 = (PyObject *)
            PyCMethod_New(rec->def,rec_capsule_1.super_object.super_handle.m_ptr,
                          scope_module.super_handle.m_ptr,0);
  (this->super_function).super_object.super_handle.m_ptr = pPVar14;
  if (pPVar14 == (PyObject *)0x0) {
    pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
  }
  pybind11::object::~object(&scope_module);
  pybind11::object::~object(&rec_capsule_1.super_object);
  signatures._M_dataplus._M_p = (pointer)&signatures.field_2;
  signatures._M_string_length = 0;
  signatures.field_2._M_allocated_capacity =
       signatures.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1a0 = (char *)CONCAT44(local_1a0._4_4_,
                               (int)CONCAT71((int7)((ulong)signatures._M_dataplus._M_p >> 8),1));
  pfVar12 = rec;
LAB_0010c81d:
  bVar18 = 1;
  iVar9 = 0;
  for (; pfVar12 != (function_record *)0x0; pfVar12 = pfVar12->next) {
    if (DAT_00123749 == 1) {
      if (0 < iVar9) {
        std::__cxx11::string::append((char *)&signatures);
      }
      if ((char)local_1a0 == '\0') {
        iVar9 = iVar9 + 1;
        std::__cxx11::to_string((string *)&scope_module,iVar9);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &rec_capsule_1,(string *)&scope_module,". ");
        std::__cxx11::string::append((string *)&signatures);
        std::__cxx11::string::~string((string *)&rec_capsule_1);
        std::__cxx11::string::~string((string *)&scope_module);
      }
      std::__cxx11::string::append((char *)&signatures);
      std::__cxx11::string::append((char *)&signatures);
      std::__cxx11::string::append((char *)&signatures);
    }
    if (((pfVar12->doc != (char *)0x0) && (*pfVar12->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if ((DAT_00123749 & 1) == 0 && bVar18 == 0) {
        std::__cxx11::string::append((char *)&signatures);
        bVar18 = 0;
      }
      else {
        bVar18 = bVar18 & DAT_00123749;
      }
      if ((DAT_00123749 & 1) != 0) {
        std::__cxx11::string::append((char *)&signatures);
      }
      std::__cxx11::string::append((char *)&signatures);
      if (DAT_00123749 == 1) {
        std::__cxx11::string::append((char *)&signatures);
      }
    }
  }
  pPVar14 = (this->super_function).super_object.super_handle.m_ptr;
  free(*(void **)(pPVar14[1].ob_refcnt + 0x18));
  pcVar10 = strdup(signatures._M_dataplus._M_p);
  *(char **)(pPVar14[1].ob_refcnt + 0x18) = pcVar10;
  if ((rec->field_0x59 & 0x10) != 0) {
    pPVar15 = (PyObject *)
              PyInstanceMethod_New((this->super_function).super_object.super_handle.m_ptr);
    (this->super_function).super_object.super_handle.m_ptr = pPVar15;
    if (pPVar15 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    _Py_DECREF(pPVar14);
  }
  std::__cxx11::string::~string((string *)&signatures);
  std::__cxx11::string::~string((string *)&signature);
  return;
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(repr(a.value).cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;
                // Separator for keyword-only arguments, placed before the kw
                // arguments start
                if (rec->nargs_kw_only > 0 && arg_index + rec->nargs_kw_only == args)
                    signature += "*, ";
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only)
                    signature += ", /";
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(rec);
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next)
                    chain = chain->next;
                chain->next = rec;
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }